

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O1

int coda_bin_cursor_read_int16_partial_array
              (coda_cursor *cursor,long offset,long length,int16_t *dst)

{
  int iVar1;
  coda_type *pcVar2;
  long lVar3;
  coda_cursor array_cursor;
  coda_cursor local_340;
  
  pcVar2 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar2->format) {
    pcVar2 = *(coda_type **)&pcVar2->type_class;
  }
  if ((*(coda_type **)(pcVar2 + 1))->format != coda_format_ascii) {
    if ((*(coda_type **)(pcVar2 + 1))->format != coda_format_binary) {
      __assert_fail("type->base_type->format == coda_format_ascii",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-bin-cursor.c"
                    ,0x4c4,
                    "int coda_bin_cursor_read_int16_partial_array(const coda_cursor *, long, long, int16_t *)"
                   );
    }
    iVar1 = read_partial_array(cursor,coda_bin_cursor_read_int16,offset,length,(uint8_t *)dst,2);
    return iVar1;
  }
  memcpy(&local_340,cursor,0x310);
  if (0 < length) {
    iVar1 = coda_cursor_goto_array_element_by_index(&local_340,offset);
    if (iVar1 != 0) {
      return -1;
    }
    lVar3 = 0;
    do {
      iVar1 = coda_ascii_cursor_read_int16(&local_340,dst);
      if (iVar1 != 0) {
        return -1;
      }
      if ((lVar3 < length + -1) &&
         (iVar1 = coda_cursor_goto_next_array_element(&local_340), iVar1 != 0)) {
        return -1;
      }
      lVar3 = lVar3 + 1;
      dst = dst + 1;
    } while (length != lVar3);
  }
  return 0;
}

Assistant:

int coda_bin_cursor_read_int16_partial_array(const coda_cursor *cursor, long offset, long length, int16_t *dst)
{
    coda_type_array *type = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (type->base_type->format == coda_format_binary)
    {
        return read_partial_array(cursor, (read_function)&coda_bin_cursor_read_int16, offset, length, (uint8_t *)dst,
                                  sizeof(int16_t));
    }
    assert(type->base_type->format == coda_format_ascii);
    return read_partial_array(cursor, (read_function)&coda_ascii_cursor_read_int16, offset, length, (uint8_t *)dst,
                              sizeof(int16_t));
}